

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutengine.cpp
# Opt level: O2

QSize QtMWidgets::qSmartMaxSize
                (QSize *sizeHint,QSize *minSize,QSize *maxSize,QSizePolicy *sizePolicy,
                Alignment align)

{
  uint uVar1;
  QSize QVar2;
  ulong uVar3;
  QSize QVar4;
  ulong uVar5;
  QSize QVar6;
  
  if ((align.i & 0x1f) == 0 || (align.i & 0x1e0) == 0) {
    QVar4 = *maxSize;
    uVar1 = minSize->ht;
    if (minSize->ht < sizeHint->ht) {
      uVar1 = sizeHint->ht;
    }
    uVar5 = (ulong)uVar1;
    QVar2 = QVar4;
    if (QVar4.wd == 0xffffff && (align.i & 0x1f) == 0) {
      uVar1 = minSize->wd;
      if (minSize->wd < sizeHint->wd) {
        uVar1 = sizeHint->wd;
      }
      QVar6.ht = 0;
      QVar6.wd = uVar1;
      QVar2.wd = 0xffffff;
      QVar2.ht = 0;
      if (((sizePolicy->field_0).data & 0x10000) == 0) {
        QVar2 = QVar6;
      }
    }
    if (((sizePolicy->field_0).data & 0x100000) != 0) {
      uVar5 = 0xffffff;
    }
    if ((align.i & 0x1e0) != 0) {
      uVar5 = (ulong)QVar4 >> 0x20;
    }
    if (QVar4.ht != 0xffffff) {
      uVar5 = (ulong)QVar4 >> 0x20;
    }
    if ((align.i & 0x1e0) != 0) {
      uVar5 = 0x7ffff;
    }
    uVar3 = (ulong)QVar2 & 0xffffffff;
    if ((align.i & 0x1f) != 0) {
      uVar3 = 0x7ffff;
    }
    return (QSize)(uVar3 | uVar5 << 0x20);
  }
  QVar4.wd = 0x7ffff;
  QVar4.ht = 0x7ffff;
  return QVar4;
}

Assistant:

QSize qSmartMaxSize( const QSize & sizeHint,
	const QSize & minSize, const QSize & maxSize,
	const QSizePolicy & sizePolicy, Qt::Alignment align )
{
	if( align & Qt::AlignHorizontal_Mask && align & Qt::AlignVertical_Mask )
		return QSize( QLAYOUTSIZE_MAX, QLAYOUTSIZE_MAX );

	QSize s = maxSize;
	QSize hint = sizeHint.expandedTo( minSize );

	if( s.width() == QWIDGETSIZE_MAX && !( align & Qt::AlignHorizontal_Mask ) )
		if( !( sizePolicy.horizontalPolicy() & QSizePolicy::GrowFlag ) )
			s.setWidth( hint.width() );

	if( s.height() == QWIDGETSIZE_MAX && !( align & Qt::AlignVertical_Mask ) )
		if( !( sizePolicy.verticalPolicy() & QSizePolicy::GrowFlag ) )
			s.setHeight( hint.height() );

	if( align & Qt::AlignHorizontal_Mask )
		s.setWidth( QLAYOUTSIZE_MAX );

	if( align & Qt::AlignVertical_Mask )
		s.setHeight( QLAYOUTSIZE_MAX );

	return s;
}